

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void __thiscall QObjectPrivate::ConnectionData::removeConnection(ConnectionData *this,Connection *c)

{
  __pointer_type pSVar1;
  QThreadData *this_00;
  __pointer_type pCVar2;
  Connection *pCVar3;
  Connection *pCVar4;
  long lVar5;
  bool bVar6;
  
  pSVar1 = (this->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value.
           _M_b._M_p;
  lVar5 = (long)((ulong)*(uint *)&c->field_0x54 << 0x25) >> 0x25;
  (c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p = (__pointer_type)0x0;
  this_00 = (c->receiverThreadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p;
  if (this_00 != (QThreadData *)0x0) {
    QThreadData::deref(this_00);
  }
  (c->receiverThreadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p =
       (__pointer_type)0x0;
  *(anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0 *)c->prev =
       (c->super_ConnectionOrSignalVector).field_0;
  pCVar3 = (c->super_ConnectionOrSignalVector).field_0.next;
  if (pCVar3 != (Connection *)0x0) {
    pCVar3->prev = c->prev;
  }
  c->prev = (Connection **)0x0;
  if (pSVar1[lVar5 + 2].super_ConnectionOrSignalVector.field_0.next == c) {
    pSVar1[lVar5 + 2].super_ConnectionOrSignalVector.field_0 =
         (anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0)
         (c->nextConnectionList).super_QBasicAtomicPointer<QObjectPrivate::Connection>._q_value._M_b
         ._M_p;
  }
  if ((Connection *)pSVar1[lVar5 + 2].allocated == c) {
    pSVar1[lVar5 + 2].allocated = (quintptr)c->prevConnectionList;
  }
  pCVar2 = (c->nextConnectionList).super_QBasicAtomicPointer<QObjectPrivate::Connection>._q_value.
           _M_b._M_p;
  if (pCVar2 != (__pointer_type)0x0) {
    pCVar2->prevConnectionList = c->prevConnectionList;
  }
  if (c->prevConnectionList != (Connection *)0x0) {
    (c->prevConnectionList->nextConnectionList).
    super_QBasicAtomicPointer<QObjectPrivate::Connection>._q_value._M_b._M_p = pCVar2;
  }
  c->prevConnectionList = (Connection *)0x0;
  pCVar3 = (Connection *)(this->orphaned)._M_i.c;
  do {
    (c->super_ConnectionOrSignalVector).field_0.next = pCVar3;
    LOCK();
    pCVar4 = (Connection *)(this->orphaned)._M_i.c;
    bVar6 = pCVar3 == pCVar4;
    if (bVar6) {
      (this->orphaned)._M_i.c = (quintptr)c;
      pCVar4 = pCVar3;
    }
    UNLOCK();
    pCVar3 = pCVar4;
  } while (!bVar6);
  return;
}

Assistant:

void QObjectPrivate::ConnectionData::removeConnection(QObjectPrivate::Connection *c)
{
    Q_ASSERT(c->receiver.loadRelaxed());
    ConnectionList &connections = signalVector.loadRelaxed()->at(c->signal_index);
    c->receiver.storeRelaxed(nullptr);
    QThreadData *td = c->receiverThreadData.loadRelaxed();
    if (td)
        td->deref();
    c->receiverThreadData.storeRelaxed(nullptr);

#ifndef QT_NO_DEBUG
    bool found = false;
    for (Connection *cc = connections.first.loadRelaxed(); cc; cc = cc->nextConnectionList.loadRelaxed()) {
        if (cc == c) {
            found = true;
            break;
        }
    }
    Q_ASSERT(found);
#endif

    // remove from the senders linked list
    *c->prev = c->next;
    if (c->next)
        c->next->prev = c->prev;
    c->prev = nullptr;

    if (connections.first.loadRelaxed() == c)
        connections.first.storeRelaxed(c->nextConnectionList.loadRelaxed());
    if (connections.last.loadRelaxed() == c)
        connections.last.storeRelaxed(c->prevConnectionList);
    Q_ASSERT(signalVector.loadRelaxed()->at(c->signal_index).first.loadRelaxed() != c);
    Q_ASSERT(signalVector.loadRelaxed()->at(c->signal_index).last.loadRelaxed() != c);

    // keep c->nextConnectionList intact, as it might still get accessed by activate
    Connection *n = c->nextConnectionList.loadRelaxed();
    if (n)
        n->prevConnectionList = c->prevConnectionList;
    if (c->prevConnectionList)
        c->prevConnectionList->nextConnectionList.storeRelaxed(n);
    c->prevConnectionList = nullptr;

    Q_ASSERT(c != static_cast<Connection *>(orphaned.load(std::memory_order_relaxed)));
    // add c to orphanedConnections
    TaggedSignalVector o = nullptr;
    /* No ABA issue here: When adding a node, we only care about the list head, it doesn't
     * matter if the tail changes.
     */
    o = orphaned.load(std::memory_order_acquire);
    do {
        c->nextInOrphanList = o;
    } while (!orphaned.compare_exchange_strong(o, TaggedSignalVector(c), std::memory_order_release));

#ifndef QT_NO_DEBUG
    found = false;
    for (Connection *cc = connections.first.loadRelaxed(); cc; cc = cc->nextConnectionList.loadRelaxed()) {
        if (cc == c) {
            found = true;
            break;
        }
    }
    Q_ASSERT(!found);
#endif

}